

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O2

void __thiscall
helics::CoreBroker::routeMessage(CoreBroker *this,ActionMessage *cmd,GlobalFederateId dest)

{
  route_id rVar1;
  ulong uVar2;
  
  if ((dest.gid != -2010000000) && (dest.gid != -1700000000)) {
    (cmd->dest_id).gid = dest.gid;
    uVar2 = 0;
    if ((dest.gid != 0) && ((this->super_BrokerBase).higher_broker_id.gid != dest.gid)) {
      rVar1 = getRoute(this,dest);
      uVar2 = (ulong)(uint)rVar1.rid;
    }
    (*(this->super_Broker)._vptr_Broker[0x23])(this,uVar2,cmd);
    return;
  }
  return;
}

Assistant:

void CoreBroker::routeMessage(ActionMessage&& cmd, GlobalFederateId dest)
{
    if (!dest.isValid()) {
        return;
    }
    cmd.dest_id = dest;
    if ((dest == parent_broker_id) || (dest == higher_broker_id)) {
        transmit(parent_route_id, std::move(cmd));
    } else {
        auto route = getRoute(dest);
        transmit(route, std::move(cmd));
    }
}